

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bit-map-type.cpp
# Opt level: O2

Up __thiscall yactfr::FixedLengthBitMapType::_clone(FixedLengthBitMapType *this)

{
  __uniq_ptr_impl<const_yactfr::FixedLengthBitMapType,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
  _Var1;
  long in_RSI;
  uint local_54;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_50;
  __uniq_ptr_impl<const_yactfr::FixedLengthBitMapType,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
  local_48;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_3c;
  ByteOrder local_34;
  
  local_54 = *(uint *)(in_RSI + 0xc);
  local_34 = *(ByteOrder *)(in_RSI + 0x18);
  local_3c._M_t.
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl._4_4_ =
       *(_Rb_tree_color *)(in_RSI + 0x1c);
  local_3c._M_t.
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl._0_4_ =
       *(undefined4 *)(in_RSI + 0x20);
  internal::tryCloneAttrs((MapItem *)&local_50);
  std::
  make_unique<yactfr::FixedLengthBitMapType_const,unsigned_int,unsigned_int,yactfr::ByteOrder,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>const&,yactfr::BitOrder,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)&local_48,&local_54,&local_34,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
              *)((long)&local_3c._M_t.
                        super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
                        .super__Head_base<0UL,_const_yactfr::MapItem_*,_false> + 4),
             (BitOrder *)(in_RSI + 0x28),&local_3c);
  _Var1._M_t.
  super__Tuple_impl<0UL,_const_yactfr::FixedLengthBitMapType_*,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
  .super__Head_base<0UL,_const_yactfr::FixedLengthBitMapType_*,_false>._M_head_impl =
       local_48._M_t.
       super__Tuple_impl<0UL,_const_yactfr::FixedLengthBitMapType_*,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
       .super__Head_base<0UL,_const_yactfr::FixedLengthBitMapType_*,_false>._M_head_impl;
  local_48._M_t.
  super__Tuple_impl<0UL,_const_yactfr::FixedLengthBitMapType_*,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
  .super__Head_base<0UL,_const_yactfr::FixedLengthBitMapType_*,_false>._M_head_impl =
       (tuple<const_yactfr::FixedLengthBitMapType_*,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
        )(_Tuple_impl<0UL,_const_yactfr::FixedLengthBitMapType_*,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
          )0x0;
  (this->super_FixedLengthBitArrayType).super_ScalarDataType.super_DataType._vptr_DataType =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_const_yactfr::FixedLengthBitMapType_*,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
       .super__Head_base<0UL,_const_yactfr::FixedLengthBitMapType_*,_false>._M_head_impl;
  std::
  unique_ptr<const_yactfr::FixedLengthBitMapType,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
  ::~unique_ptr((unique_ptr<const_yactfr::FixedLengthBitMapType,_std::default_delete<const_yactfr::FixedLengthBitMapType>_>
                 *)&local_48);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_50);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthBitMapType::_clone() const
{
    return FixedLengthBitMapType::create(this->alignment(), this->length(), this->byteOrder(),
                                         _flags, this->bitOrder(),
                                         internal::tryCloneAttrs(this->attributes()));
}